

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void duckdb::CreateSortKeyHelpers::CreateSortKey
               (DataChunk *input,vector<duckdb::OrderModifiers,_true> *modifiers,Vector *result)

{
  OrderModifiers modifiers_00;
  idx_t size;
  reference input_00;
  const_reference pvVar1;
  SortKeyVectorData *this;
  size_type __n;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  sort_key_data;
  _Head_base<0UL,_duckdb::SortKeyVectorData_*,_false> local_60;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  local_58;
  Vector *local_38;
  
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = result;
  if ((modifiers->super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>).
      super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (modifiers->super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>).
      super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
      size = input->count;
      pvVar1 = vector<duckdb::OrderModifiers,_true>::operator[](modifiers,__n);
      this = (SortKeyVectorData *)operator_new(0x78);
      modifiers_00.order_type = pvVar1->order_type;
      modifiers_00.null_type = pvVar1->null_type;
      SortKeyVectorData::SortKeyVectorData(this,input_00,size,modifiers_00);
      local_60._M_head_impl = this;
      ::std::
      vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>
                ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
                  *)&local_58,
                 (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                  *)&local_60);
      ::std::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
      ::~unique_ptr((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
                     *)&local_60);
      __n = __n + 1;
    } while (__n < (ulong)((long)(modifiers->
                                 super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                 ).
                                 super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(modifiers->
                                 super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                 ).
                                 super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 1));
  }
  CreateSortKeyInternal
            ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
              *)&local_58,modifiers,local_38,input->count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void CreateSortKeyHelpers::CreateSortKey(DataChunk &input, const vector<OrderModifiers> &modifiers, Vector &result) {
	vector<unique_ptr<SortKeyVectorData>> sort_key_data;
	D_ASSERT(modifiers.size() == input.ColumnCount());
	for (idx_t r = 0; r < modifiers.size(); r++) {
		sort_key_data.push_back(make_uniq<SortKeyVectorData>(input.data[r], input.size(), modifiers[r]));
	}
	CreateSortKeyInternal(sort_key_data, modifiers, result, input.size());
}